

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtype.cc
# Opt level: O1

void __thiscall verona::Assume::Assume(Assume *this,Btype *sub_,Btype *sup_)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  Token *pTVar2;
  undefined1 *local_28;
  undefined1 *local_20;
  
  (this->sub).super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (sub_->super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (sub_->super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (this->sub).super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->sup).super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (sup_->super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (sup_->super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (this->sup).super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  local_28 = Class;
  local_20 = Trait;
  pTVar2 = ::std::
           __find_if<trieste::Token_const*,__gnu_cxx::__ops::_Iter_equals_val<trieste::Token_const>>
                     (&local_28,&stack0xffffffffffffffe8,
                      &((((this->sub).
                          super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        node).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->type_);
  if (pTVar2 != (Token *)&stack0xffffffffffffffe8) {
    if ((((((this->sup).super___shared_ptr<verona::BtypeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          node).super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->type_).def
        == (TokenDef *)Trait) {
      return;
    }
    __assert_fail("sup == Trait",
                  "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/subtype.cc"
                  ,0x26,"verona::Assume::Assume(Btype, Btype)");
  }
  __assert_fail("sub->in({Class, Trait})",
                "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/subtype.cc"
                ,0x25,"verona::Assume::Assume(Btype, Btype)");
}

Assistant:

Assume(Btype sub_, Btype sup_) : sub(sub_), sup(sup_)
    {
      assert(sub->in({Class, Trait}));
      assert(sup == Trait);
    }